

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O2

string * __thiscall
flatbuffers::IdlNamer::NamespacedObjectType_abi_cxx11_
          (string *__return_storage_ptr__,IdlNamer *this,Definition *def)

{
  Namespace *ns;
  string local_40;
  
  ns = def->defined_namespace;
  (*(this->super_Namer)._vptr_Namer[0x11])(&local_40);
  NamespacedString(__return_storage_ptr__,this,ns,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedObjectType(const Definition &def) const {
    return NamespacedString(def.defined_namespace, ObjectType(def.name));
  }